

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::lts_20250127::debugging_internal::ParseUnresolvedQualifierLevel(State *state)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  ParseState copy;
  
  iVar1 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar1 + 1;
  state->steps = iVar2 + 1;
  if (iVar2 < 0x20000 && iVar1 < 0x100) {
    bVar5 = ParseSourceName(state);
    if (bVar5) {
      bVar6 = true;
      ParseTemplateArgs(state);
      goto LAB_010284d2;
    }
    iVar1 = (state->parse_state).mangled_idx;
    iVar2 = (state->parse_state).out_cur_idx;
    iVar3 = (state->parse_state).prev_name_idx;
    uVar4 = *(undefined4 *)&(state->parse_state).field_0xc;
    bVar5 = ParseSubstitution(state,false);
    if (bVar5) {
      bVar5 = ParseTemplateArgs(state);
      bVar6 = true;
      if (bVar5) goto LAB_010284d2;
    }
    (state->parse_state).mangled_idx = iVar1;
    (state->parse_state).out_cur_idx = iVar2;
    (state->parse_state).prev_name_idx = iVar3;
    *(undefined4 *)&(state->parse_state).field_0xc = uVar4;
  }
  bVar6 = false;
LAB_010284d2:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar6;
}

Assistant:

static bool ParseUnresolvedQualifierLevel(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;

  if (ParseSimpleId(state)) return true;

  ParseState copy = state->parse_state;
  if (ParseSubstitution(state, /*accept_std=*/false) &&
      ParseTemplateArgs(state)) {
    return true;
  }
  state->parse_state = copy;
  return false;
}